

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::SweepObjects<(Memory::SweepMode)1>(LargeHeapBlock *this,Recycler *recycler)

{
  size_t size;
  LargeHeapBlockFreeListEntry *pLVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  LargeObjectHeader *pLVar8;
  ConfigFlagsTable *pCVar9;
  void *address;
  char *address_00;
  LargeHeapBlockFreeListEntry *entry;
  LargeHeapBlockFreeListEntry *head;
  size_t objectSize;
  uchar attributes;
  LargeObjectHeader *header;
  uint local_28;
  uint i;
  uint sweepCount;
  uint markCount;
  HeapBlockMap *heapBlockMap;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  if (((this->super_HeapBlock).isPendingConcurrentSweep & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7ac,"(mode == SweepMode_InThread || this->isPendingConcurrentSweep)",
                       "mode == SweepMode_InThread || this->isPendingConcurrentSweep");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar5 = GetMarkCount(this);
  if ((this->expectedSweepCount != this->allocCount - uVar5) &&
     (BVar6 = Recycler::IsConcurrentSweepState(recycler), BVar6 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7b7,
                       "(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState())"
                       ,
                       "expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((this->expectedSweepCount == 0) && (((this->super_HeapBlock).isForceSweeping & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x7bb,"(expectedSweepCount != 0 || isForceSweeping)",
                       "expectedSweepCount != 0 || isForceSweeping");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  local_28 = 0;
  header._4_4_ = 0;
  do {
    if (this->lastCollectAllocCount <= header._4_4_) {
      if (local_28 != this->expectedSweepCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x7f6,"(sweepCount == expectedSweepCount)",
                           "sweepCount == expectedSweepCount");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      (this->super_HeapBlock).isPendingConcurrentSweep = false;
      return;
    }
    (recycler->collectionStats).objectSweepScanCount =
         (ulong)(((this->super_HeapBlock).isForceSweeping ^ 0xffU) & 1) +
         (recycler->collectionStats).objectSweepScanCount;
    pLVar8 = GetHeaderByIndex(this,header._4_4_);
    if (pLVar8 == (LargeObjectHeader *)0x0) {
      if (this->expectedSweepCount == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x7c6,"(expectedSweepCount != 0)","expectedSweepCount != 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this->expectedSweepCount = this->expectedSweepCount - 1;
      pCVar9 = Recycler::GetRecyclerFlagsTable(recycler);
      if ((pCVar9->Verbose & 1U) != 0) {
        pCVar9 = Recycler::GetRecyclerFlagsTable(recycler);
        bVar3 = Js::Phases::IsEnabled(&pCVar9->Trace,MemoryAllocationPhase);
        if (!bVar3) {
          pCVar9 = Recycler::GetRecyclerFlagsTable(recycler);
          bVar3 = Js::Phases::IsEnabled(&pCVar9->Trace,LargeMemoryAllocationPhase);
          if (!bVar3) goto LAB_00968bec;
        }
        Output::Print(L"Index %d empty\n",(ulong)header._4_4_);
      }
    }
    else {
      if (pLVar8->objectIndex != header._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,1999,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      address = LargeObjectHeader::GetAddress(pLVar8);
      bVar3 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
      if (bVar3) {
        bVar4 = LargeObjectHeader::GetAttributes(pLVar8,recycler->Cookie);
        if ((bVar4 & 4) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x7d6,"((attributes & NewFinalizeBit) == 0)",
                             "(attributes & NewFinalizeBit) == 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pLVar8 = GetHeaderByIndex(this,header._4_4_);
        (recycler->collectionStats).largeHeapBlockUsedByteCount =
             pLVar8->objectSize + (recycler->collectionStats).largeHeapBlockUsedByteCount;
      }
      else {
        size = pLVar8->objectSize;
        address_00 = (char *)LargeObjectHeader::GetAddress(pLVar8);
        Recycler::NotifyFree(recycler,address_00,size);
        SweepObject<(Memory::SweepMode)1>(this,recycler,pLVar8);
        bVar3 = LargeHeapBucket::SupportFreeList(this->bucket);
        if ((bVar3) && (((this->super_HeapBlock).isForceSweeping & 1U) == 0)) {
          pLVar1 = (this->freeList).entries;
          pLVar8->objectIndex = header._4_4_;
          pLVar8->next = (LargeObjectHeader *)this;
          *(LargeHeapBlockFreeListEntry **)&pLVar8->attributesAndChecksum = pLVar1;
          pLVar8->objectSize = size;
          (this->freeList).entries = (LargeHeapBlockFreeListEntry *)pLVar8;
        }
        local_28 = local_28 + 1;
      }
    }
LAB_00968bec:
    header._4_4_ = header._4_4_ + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::SweepObjects(Recycler * recycler)
{
#if ENABLE_CONCURRENT_GC
    Assert(mode == SweepMode_InThread || this->isPendingConcurrentSweep);
#else
    Assert(mode == SweepMode_InThread);
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
#if DBG
    uint markCount = GetMarkCount();

    // mark count included newly allocated objects
#if ENABLE_CONCURRENT_GC
    Assert(expectedSweepCount == allocCount - markCount || recycler->IsConcurrentSweepState());
#else
    Assert(expectedSweepCount == allocCount - markCount);
#endif
    Assert(expectedSweepCount != 0 || isForceSweeping);
    uint sweepCount = 0;
#endif

    for (uint i = 0; i < lastCollectAllocCount; i++)
    {
        RECYCLER_STATS_ADD(recycler, objectSweepScanCount, !isForceSweeping);
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
#if DBG
            Assert(expectedSweepCount != 0);
            expectedSweepCount--;
#endif
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Index %d empty\n"), i);
#endif
            continue;
        }

        Assert(header->objectIndex == i);

        // Skip sweep if the object is alive
        if (heapBlockMap.IsMarked(header->GetAddress()))
        {
#if DBG
            unsigned char attributes = header->GetAttributes(recycler->Cookie);
            Assert((attributes & NewFinalizeBit) == 0);
#endif

            RECYCLER_STATS_ADD(recycler, largeHeapBlockUsedByteCount, this->GetHeaderByIndex(i)->objectSize);
            continue;
        }

        size_t objectSize = header->objectSize;
        recycler->NotifyFree((char *)header->GetAddress(), objectSize);

        SweepObject<mode>(recycler, header);

        if (this->bucket->SupportFreeList()
#ifdef RECYCLER_STATS
            && !isForceSweeping
#endif
            )
        {
            LargeHeapBlockFreeListEntry* head = this->freeList.entries;
            LargeHeapBlockFreeListEntry* entry = (LargeHeapBlockFreeListEntry*) header;
            entry->headerIndex = i;
            entry->heapBlock = this;
            entry->next = head;
            entry->objectSize = objectSize;
            this->freeList.entries = entry;
        }

#if DBG
        sweepCount++;
#endif
    }

    Assert(sweepCount == expectedSweepCount);
#if ENABLE_CONCURRENT_GC
    this->isPendingConcurrentSweep = false;
#endif
}